

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::IsRootDirectory(FilePath *this)

{
  long lVar1;
  char *pcVar2;
  undefined1 local_11;
  FilePath *this_local;
  
  lVar1 = std::__cxx11::string::length();
  local_11 = false;
  if (lVar1 == 1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_11 = IsPathSeparator(*pcVar2);
  }
  return local_11;
}

Assistant:

bool FilePath::IsRootDirectory() const {
#if GTEST_OS_WINDOWS
  // FIXME: on Windows a network share like
  // \\server\share can be a root directory, although it cannot be the
  // current directory.  Handle this properly.
  return pathname_.length() == 3 && IsAbsolutePath();
#else
  return pathname_.length() == 1 && IsPathSeparator(pathname_.c_str()[0]);
#endif
}